

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O3

int __thiscall Fl_Input_::position(Fl_Input_ *this,int p,int m)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  
  if (p < 1) {
    p = 0;
  }
  was_up_down = 0;
  uVar12 = 0;
  if (0 < m) {
    uVar12 = m;
  }
  uVar1 = this->size_;
  if ((int)uVar1 <= (int)uVar12) {
    uVar12 = uVar1;
  }
  uVar3 = p;
  if ((int)uVar1 <= p) {
    uVar3 = uVar1;
  }
  uVar10 = (ulong)uVar3;
  if ((0 < (int)uVar3 && p < (int)uVar1) && (int)uVar3 < this->position_) {
    uVar9 = (ulong)uVar3;
    do {
      iVar5 = fl_utf8len(this->value_[uVar9]);
      uVar10 = uVar9;
      if (((0 < iVar5) || (uVar10 = uVar9 - 1, (long)uVar9 < 2)) ||
         ((long)this->position_ < (long)uVar9)) break;
      bVar2 = (long)uVar9 <= (long)this->size_;
      uVar9 = uVar10;
    } while (bVar2);
  }
  iVar8 = (int)uVar10;
  iVar6 = fl_utf8len(this->value_[iVar8]);
  iVar5 = this->size_;
  if ((iVar8 < iVar5) && (lVar11 = (long)iVar8, this->position_ < iVar8)) {
    while (iVar6 < 0) {
      iVar8 = iVar8 + 1;
      iVar6 = fl_utf8len(this->value_[lVar11 + 1]);
      iVar5 = this->size_;
      if (((long)iVar5 <= lVar11 + 1) ||
         (bVar2 = lVar11 < this->position_, lVar11 = lVar11 + 1, bVar2)) break;
    }
  }
  uVar10 = (ulong)uVar12;
  if ((int)uVar12 < iVar5 && (0 < (int)uVar12 && (int)uVar12 < this->mark_)) {
    uVar9 = (ulong)uVar12;
    do {
      iVar5 = fl_utf8len(this->value_[uVar9]);
      uVar10 = uVar9;
      if (((0 < iVar5) || (uVar10 = uVar9 - 1, (long)uVar9 < 2)) ||
         ((long)this->mark_ < (long)uVar9)) break;
      bVar2 = (long)uVar9 <= (long)this->size_;
      uVar9 = uVar10;
    } while (bVar2);
  }
  iVar5 = (int)uVar10;
  lVar11 = (long)iVar5;
  iVar6 = fl_utf8len(this->value_[lVar11]);
  if (iVar5 < this->size_) {
    do {
      if ((lVar11 <= this->mark_) || (-1 < iVar6)) break;
      lVar4 = lVar11 + 1;
      lVar11 = lVar11 + 1;
      iVar6 = fl_utf8len(this->value_[lVar4]);
    } while (lVar11 < this->size_);
    iVar5 = (int)lVar11;
  }
  if (uVar3 == uVar12) {
    iVar5 = iVar8;
  }
  iVar6 = this->position_;
  iVar7 = this->mark_;
  if ((iVar8 == iVar6) && (iVar5 == iVar7)) {
    return 0;
  }
  if (iVar8 == iVar5) {
    if (iVar6 == iVar7) {
      if (((Fl_Input_ *)Fl::focus_ == this) && (((this->super_Fl_Widget).damage_ & 2) == 0)) {
        minimal_update(this,iVar6);
        this->erase_cursor_only = '\x01';
      }
      goto LAB_001bbbc1;
    }
    if (iVar7 < iVar6) {
      iVar6 = iVar7;
    }
  }
  else {
    if (iVar8 != iVar6) {
      if (iVar8 < iVar6) {
        iVar6 = iVar8;
      }
      minimal_update(this,iVar6);
      iVar7 = this->mark_;
    }
    if (iVar5 == iVar7) goto LAB_001bbbc1;
    iVar6 = iVar7;
    if (iVar5 < iVar7) {
      iVar6 = iVar5;
    }
  }
  minimal_update(this,iVar6);
LAB_001bbbc1:
  this->position_ = iVar8;
  this->mark_ = iVar5;
  return 1;
}

Assistant:

int Fl_Input_::position(int p, int m) {
  int is_same = 0;
  was_up_down = 0;
  if (p<0) p = 0;
  if (p>size()) p = size();
  if (m<0) m = 0;
  if (m>size()) m = size();
  if (p == m) is_same = 1;

  while (p < position_ && p > 0 && (size() - p) > 0 &&
       (fl_utf8len((char)(value() + p)[0]) < 1)) { p--; }
  int ul = fl_utf8len((char)(value() + p)[0]);
  while (p < size() && p > position_ && ul < 0) {
       p++;
       ul = fl_utf8len((char)(value() + p)[0]);
  }

  while (m < mark_ && m > 0 && (size() - m) > 0 &&
       (fl_utf8len((char)(value() + m)[0]) < 1)) { m--; }
  ul = fl_utf8len((char)(value() + m)[0]);
  while (m < size() && m > mark_ && ul < 0) {
       m++;
       ul = fl_utf8len((char)(value() + m)[0]);
  }
  if (is_same) m = p;
  if (p == position_ && m == mark_) return 0;


  //if (Fl::selection_owner() == this) Fl::selection_owner(0);
  if (p != m) {
    if (p != position_) minimal_update(position_, p);
    if (m != mark_) minimal_update(mark_, m);
  } else {
    // new position is a cursor
    if (position_ == mark_) {
      // old position was just a cursor
      if (Fl::focus() == this && !(damage()&FL_DAMAGE_EXPOSE)) {
	minimal_update(position_); erase_cursor_only = 1;
      }
    } else { // old position was a selection
      minimal_update(position_, mark_);
    }
  }
  position_ = p;
  mark_ = m;
  return 1;
}